

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeMeshless::ChNodeMeshless(ChNodeMeshless *this,ChNodeMeshless *other)

{
  ChCollisionModel *pCVar1;
  double dVar2;
  ChCollisionModelBullet *this_00;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x2c0);
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_011504f8;
  ChNodeXYZ::ChNodeXYZ
            (&this->super_ChNodeXYZ,&PTR_construction_vtable_128__011734d0,&other->super_ChNodeXYZ);
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x2c0 = 0x1173410;
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)0x1173140;
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x50 = 0x1173290;
  *(undefined8 *)&this->field_0x68 = 0x1173338;
  (this->pos_ref).m_data[2] = 0.0;
  (this->pos_ref).m_data[0] = 0.0;
  (this->pos_ref).m_data[1] = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->t_strain);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->p_strain);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->e_strain);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&this->e_stress);
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->UserForce).m_data[2] = 0.0;
  (this->UserForce).m_data[0] = 0.0;
  (this->UserForce).m_data[1] = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])
            (this_00,&(this->super_ChNodeXYZ).field_0x50);
  pCVar1 = this->collision_model;
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,
             &(other->container->matsurface).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  (*pCVar1->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar1,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  if (other != this) {
    (this->pos_ref).m_data[0] = (other->pos_ref).m_data[0];
    (this->pos_ref).m_data[1] = (other->pos_ref).m_data[1];
    (this->pos_ref).m_data[2] = (other->pos_ref).m_data[2];
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
  }
  SetKernelRadius(this,other->h_rad);
  SetCollisionRadius(this,other->coll_rad);
  (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
  (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
  dVar2 = other->density;
  this->volume = other->volume;
  this->density = dVar2;
  this->hardening = other->hardening;
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)&this->t_strain,
             (Matrix<double,_6,_1,_0,_6,_1> *)&other->t_strain);
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)&this->p_strain,
             (Matrix<double,_6,_1,_0,_6,_1> *)&other->p_strain);
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)&this->e_strain,
             (Matrix<double,_6,_1,_0,_6,_1> *)&other->e_strain);
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            ((Matrix<double,_6,_1,_0,_6,_1> *)&this->e_stress,
             (Matrix<double,_6,_1,_0,_6,_1> *)&other->e_stress);
  this->container = other->container;
  ChVariablesNode::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChNodeMeshless::ChNodeMeshless(const ChNodeMeshless& other) : ChNodeXYZ(other) {
    collision_model = new ChCollisionModelBullet;
    collision_model->SetContactable(this);
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);

    pos_ref = other.pos_ref;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;
    hardening = other.hardening;

    t_strain = other.t_strain;
    p_strain = other.p_strain;
    e_strain = other.e_strain;
    e_stress = other.e_stress;

    container = other.container;

    variables = other.variables;
}